

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void rev_ffd(kcc_joint *joint,mc_abi *m,joint_torque *tau,mc_wrench *f,int count)

{
  double dVar1;
  double dVar2;
  joint_axis jVar3;
  double dVar4;
  int local_4c;
  int j;
  double qdd;
  int i;
  double d;
  int k;
  int count_local;
  mc_wrench *f_local;
  joint_torque *tau_local;
  mc_abi *m_local;
  kcc_joint *joint_local;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x147,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (m == (mc_abi *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x148,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (tau == (joint_torque *)0x0) {
    __assert_fail("tau",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x149,
                  "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
                 );
  }
  if (f != (mc_wrench *)0x0) {
    jVar3 = (joint->field_1).revolute_joint.axis;
    dVar1 = *(double *)
             ((long)&(m->second_moment_of_mass).field_0 +
             (long)(int)jVar3 * 8 + (long)(int)jVar3 * 0x18);
    dVar2 = *(joint->field_1).revolute_joint.inertia;
    for (qdd._4_4_ = 0; qdd._4_4_ < count; qdd._4_4_ = qdd._4_4_ + 1) {
      dVar4 = tau[qdd._4_4_] / (dVar1 + dVar2);
      for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
        f->torque[qdd._4_4_].field_0.data[local_4c] =
             *(double *)
              ((long)&(m->second_moment_of_mass).field_0 +
              (long)(int)jVar3 * 8 + (long)local_4c * 0x18) * dVar4;
        f->force[qdd._4_4_].field_0.data[local_4c] =
             *(double *)
              ((long)&(m->first_moment_of_mass).field_0 +
              (long)local_4c * 8 + (long)(int)jVar3 * 0x18) * dVar4;
      }
    }
    return;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x14a,
                "void rev_ffd(const struct kcc_joint *, const struct mc_abi *, const joint_torque *, struct mc_wrench *, int)"
               );
}

Assistant:

static void rev_ffd(
        const struct kcc_joint *joint,
        const struct mc_abi *m,
        const joint_torque *tau,
        struct mc_wrench *f,
        int count)
{
    assert(joint);
    assert(m);
    assert(tau);
    assert(f);

    int k = joint->revolute_joint.axis;
    double d = m->second_moment_of_mass.row[k].data[k]
            + joint->revolute_joint.inertia[0];

    for (int i = 0; i < count; i++) {
        double qdd = tau[i] / d;
        for (int j = 0; j < 3; j++) {
            f->torque[i].data[j] = m->second_moment_of_mass.row[j].data[k] * qdd;
            f->force[i].data[j] = m->first_moment_of_mass.row[k].data[j] * qdd;    // consider transpose, thus [k, j]
        }
    }
}